

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2aTextureFilteringTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles2::Accuracy::Texture2DFilteringCase::iterate(Texture2DFilteringCase *this)

{
  TestLog *pTVar1;
  Texture2D *pTVar2;
  pointer ppTVar3;
  RenderContext *context;
  TestContext *this_00;
  int iVar4;
  deUint32 seed;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  NotSupportedError *this_01;
  int width;
  uint height;
  Texture2D *format;
  uint width_00;
  int height_00;
  bool bVar6;
  RandomViewport viewport;
  vector<float,_std::allocator<float>_> texCoord;
  Surface referenceFrame;
  Surface renderedFrame;
  ReferenceParams refParams;
  TextureFormatInfo fmtInfo;
  RandomViewport local_308;
  vector<float,_std::allocator<float>_> local_2f8;
  TextureRenderer *local_2e0;
  undefined1 local_2d8 [8];
  ConstPixelBufferAccess *local_2d0;
  long local_2c8 [2];
  Surface local_2b8;
  Surface local_2a0;
  TestLog *local_288;
  undefined1 local_27c [76];
  int aiStack_230 [4];
  int aiStack_220 [2];
  void *local_218;
  undefined4 local_210;
  undefined8 local_20c;
  bool bStack_204;
  undefined3 uStack_203;
  DepthStencilMode DStack_200;
  LodMode local_1fc;
  undefined1 local_1e8 [112];
  ios_base local_178 [264];
  TextureFormatInfo local_70;
  long lVar5;
  
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar4);
  pTVar1 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  seed = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_308,(RenderTarget *)CONCAT44(extraout_var_00,iVar4),0x100,0x100,seed);
  tcu::Surface::Surface(&local_2a0,local_308.width,local_308.height);
  tcu::Surface::Surface(&local_2b8,local_308.width,local_308.height);
  format = &(*(this->m_textures).
              super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
              super__Vector_impl_data._M_start)->m_refTexture;
  tcu::getTextureFormatInfo(&local_70,(TextureFormat *)format);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_27c,TEXTURETYPE_2D);
  local_2f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_2f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_2f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((0xff < local_308.width) && (0xff < local_308.height)) {
    local_288 = pTVar1;
    (**(code **)(lVar5 + 8))(0x84c0);
    (**(code **)(lVar5 + 0xb8))
              (0xde1,(*(this->m_textures).
                       super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>.
                       _M_impl.super__Vector_impl_data._M_start)->m_glTexture);
    (**(code **)(lVar5 + 0x1360))(0xde1,0x2802,this->m_wrapS);
    (**(code **)(lVar5 + 0x1360))(0xde1,0x2803,this->m_wrapT);
    (**(code **)(lVar5 + 0x1360))(0xde1,0x2801,this->m_minFilter);
    (**(code **)(lVar5 + 0x1360))(0xde1,0x2800,this->m_magFilter);
    glu::mapGLSampler((Sampler *)local_1e8,this->m_wrapS,this->m_wrapT,this->m_minFilter,
                      this->m_magFilter);
    aiStack_230[2] = local_1e8._16_4_;
    aiStack_230[3] = local_1e8._20_4_;
    aiStack_220[0] = local_1e8._24_4_;
    aiStack_220[1] = local_1e8._28_4_;
    local_27c._68_8_ = local_1e8._0_8_;
    aiStack_230[0] = local_1e8._8_4_;
    aiStack_230[1] = local_1e8._12_4_;
    local_218 = (void *)local_1e8._32_8_;
    local_210 = local_1e8._40_4_;
    local_20c = local_1e8._44_8_;
    bStack_204 = (bool)local_1e8[0x34];
    uStack_203 = local_1e8._53_3_;
    DStack_200 = local_1e8._56_4_;
    local_27c._4_4_ =
         glu::TextureTestUtil::getSamplerType((format->super_TextureLevelPyramid).m_format);
    width_00 = (uint)local_308.width >> 1;
    height = (uint)local_308.height >> 1;
    local_1fc = LODMODE_EXACT;
    local_27c._52_4_ = local_70.lookupBias.m_data[0];
    local_27c._56_4_ = local_70.lookupBias.m_data[1];
    local_27c._60_4_ = local_70.lookupBias.m_data[2];
    local_27c._64_4_ = local_70.lookupBias.m_data[3];
    local_27c._36_4_ = local_70.lookupScale.m_data[0];
    local_27c._40_4_ = local_70.lookupScale.m_data[1];
    local_27c._44_4_ = local_70.lookupScale.m_data[2];
    local_27c._48_4_ = local_70.lookupScale.m_data[3];
    (**(code **)(lVar5 + 0x1a00))(local_308.x,local_308.y,width_00,height);
    local_1e8._0_4_ = 0xc0800000;
    local_1e8._4_4_ = 0xc0900000;
    local_2d8._0_4_ = 0x40800000;
    local_2d8._4_4_ = 0x40200000;
    glu::TextureTestUtil::computeQuadTexCoord2D(&local_2f8,(Vec2 *)local_1e8,(Vec2 *)local_2d8);
    local_2e0 = &this->m_renderer;
    deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
              (local_2e0,0,
               local_2f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(RenderParams *)local_27c);
    iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    tcu::SurfaceAccess::SurfaceAccess
              ((SurfaceAccess *)local_1e8,&local_2b8,
               (PixelFormat *)(CONCAT44(extraout_var_01,iVar4) + 8),0,0,width_00,height);
    pTVar2 = *(this->m_textures).
              super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_2d0 = (pTVar2->m_refTexture).m_view.m_levels;
    local_2d8._0_4_ = (pTVar2->m_refTexture).m_view.m_numLevels;
    glu::TextureTestUtil::sampleTexture
              ((SurfaceAccess *)local_1e8,(Texture2DView *)local_2d8,
               local_2f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(ReferenceParams *)local_27c);
    width = local_308.width - width_00;
    (**(code **)(lVar5 + 0x1a00))(local_308.x + width_00,local_308.y,width,height);
    local_1e8._0_4_ = 0xbf000000;
    local_1e8._4_4_ = 0x3f400000;
    local_2d8._0_4_ = 0x3e800000;
    local_2d8._4_4_ = 0x3fa00000;
    glu::TextureTestUtil::computeQuadTexCoord2D(&local_2f8,(Vec2 *)local_1e8,(Vec2 *)local_2d8);
    deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
              (local_2e0,0,
               local_2f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(RenderParams *)local_27c);
    iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    tcu::SurfaceAccess::SurfaceAccess
              ((SurfaceAccess *)local_1e8,&local_2b8,
               (PixelFormat *)(CONCAT44(extraout_var_02,iVar4) + 8),width_00,0,width,height);
    pTVar2 = *(this->m_textures).
              super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_2d0 = (pTVar2->m_refTexture).m_view.m_levels;
    local_2d8._0_4_ = (pTVar2->m_refTexture).m_view.m_numLevels;
    glu::TextureTestUtil::sampleTexture
              ((SurfaceAccess *)local_1e8,(Texture2DView *)local_2d8,
               local_2f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(ReferenceParams *)local_27c);
    ppTVar3 = (this->m_textures).
              super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    bVar6 = 8 < (ulong)((long)(this->m_textures).
                              super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3);
    if (bVar6) {
      (**(code **)(lVar5 + 0xb8))(0xde1,ppTVar3[1]->m_glTexture);
      (**(code **)(lVar5 + 0x1360))(0xde1,0x2802,this->m_wrapS);
      (**(code **)(lVar5 + 0x1360))(0xde1,0x2803,this->m_wrapT);
      (**(code **)(lVar5 + 0x1360))(0xde1,0x2801,this->m_minFilter);
      (**(code **)(lVar5 + 0x1360))(0xde1,0x2800,this->m_magFilter);
    }
    height_00 = local_308.height - height;
    (**(code **)(lVar5 + 0x1a00))(local_308.x,local_308.y + height,width_00,height_00);
    pTVar2 = (this->m_textures).
             super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
             super__Vector_impl_data._M_start[bVar6];
    local_2d8._0_4_ = ((float)width_00 * 1.2) / (float)(pTVar2->m_refTexture).m_width + -0.5;
    local_2d8._4_4_ = ((float)height_00 * 1.1) / (float)(pTVar2->m_refTexture).m_height + -0.2;
    local_1e8._0_4_ = 0xbf000000;
    local_1e8._4_4_ = 0xbe4ccccd;
    glu::TextureTestUtil::computeQuadTexCoord2D(&local_2f8,(Vec2 *)local_1e8,(Vec2 *)local_2d8);
    deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
              (local_2e0,0,
               local_2f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(RenderParams *)local_27c);
    iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    tcu::SurfaceAccess::SurfaceAccess
              ((SurfaceAccess *)local_1e8,&local_2b8,
               (PixelFormat *)(CONCAT44(extraout_var_03,iVar4) + 8),0,height,width_00,height_00);
    pTVar2 = (this->m_textures).
             super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
             super__Vector_impl_data._M_start[bVar6];
    local_2d0 = (pTVar2->m_refTexture).m_view.m_levels;
    local_2d8._0_4_ = (pTVar2->m_refTexture).m_view.m_numLevels;
    glu::TextureTestUtil::sampleTexture
              ((SurfaceAccess *)local_1e8,(Texture2DView *)local_2d8,
               local_2f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(ReferenceParams *)local_27c);
    (**(code **)(lVar5 + 0x1a00))(local_308.x + width_00,local_308.y + height,width,height_00);
    local_1e8._0_4_ = 0xbf000000;
    local_1e8._4_4_ = 0x3f400000;
    local_2d8._0_4_ = 0x3e800000;
    local_2d8._4_4_ = 0x3fa00000;
    glu::TextureTestUtil::computeQuadTexCoord2D(&local_2f8,(Vec2 *)local_1e8,(Vec2 *)local_2d8);
    deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
              (local_2e0,0,
               local_2f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(RenderParams *)local_27c);
    iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    tcu::SurfaceAccess::SurfaceAccess
              ((SurfaceAccess *)local_1e8,&local_2b8,
               (PixelFormat *)(CONCAT44(extraout_var_04,iVar4) + 8),width_00,height,width,height_00)
    ;
    pTVar2 = (this->m_textures).
             super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
             super__Vector_impl_data._M_start[bVar6];
    local_2d0 = (pTVar2->m_refTexture).m_view.m_levels;
    local_2d8._0_4_ = (pTVar2->m_refTexture).m_view.m_numLevels;
    glu::TextureTestUtil::sampleTexture
              ((SurfaceAccess *)local_1e8,(Texture2DView *)local_2d8,
               local_2f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(ReferenceParams *)local_27c);
    pTVar1 = local_288;
    context = this->m_renderCtx;
    local_2d8._0_4_ = RGBA;
    local_2d8._4_4_ = UNORM_INT8;
    if ((void *)local_2a0.m_pixels.m_cap != (void *)0x0) {
      local_2a0.m_pixels.m_cap = (size_t)local_2a0.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1e8,(TextureFormat *)local_2d8,local_2a0.m_width,
               local_2a0.m_height,1,(void *)local_2a0.m_pixels.m_cap);
    glu::readPixels(context,local_308.x,local_308.y,(PixelBufferAccess *)local_1e8);
    iVar4 = glu::TextureTestUtil::measureAccuracy(pTVar1,&local_2b8,&local_2a0,0x10,0xc80);
    this_00 = (this->super_TestCase).super_TestNode.m_testCtx;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
    std::ostream::operator<<(local_1e8,iVar4);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
    std::ios_base::~ios_base(local_178);
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,(char *)local_2d8);
    if (local_2d8 != (undefined1  [8])local_2c8) {
      operator_delete((void *)local_2d8,local_2c8[0] + 1);
    }
    if (local_2f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (float *)0x0) {
      operator_delete(local_2f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    tcu::Surface::~Surface(&local_2b8);
    tcu::Surface::~Surface(&local_2a0);
    return STOP;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Too small viewport","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/accuracy/es2aTextureFilteringTests.cpp"
             ,0xd2);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

Texture2DFilteringCase::IterateResult Texture2DFilteringCase::iterate (void)
{
	const glw::Functions&		gl					= m_renderCtx.getFunctions();
	TestLog&					log					= m_testCtx.getLog();
	const int					defViewportWidth	= 256;
	const int					defViewportHeight	= 256;
	RandomViewport				viewport			(m_renderCtx.getRenderTarget(), defViewportWidth, defViewportHeight, deStringHash(getName()));
	tcu::Surface				renderedFrame		(viewport.width, viewport.height);
	tcu::Surface				referenceFrame		(viewport.width, viewport.height);
	const tcu::TextureFormat&	texFmt				= m_textures[0]->getRefTexture().getFormat();
	tcu::TextureFormatInfo		fmtInfo				= tcu::getTextureFormatInfo(texFmt);
	ReferenceParams				refParams			(TEXTURETYPE_2D);
	vector<float>				texCoord;

	// Accuracy measurements are off unless viewport size is 256x256
	if (viewport.width < defViewportWidth || viewport.height < defViewportHeight)
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	// Viewport is divided into 4 sections.
	int				leftWidth			= viewport.width / 2;
	int				rightWidth			= viewport.width - leftWidth;
	int				bottomHeight		= viewport.height / 2;
	int				topHeight			= viewport.height - bottomHeight;

	int				curTexNdx			= 0;

	// Use unit 0.
	gl.activeTexture(GL_TEXTURE0);

	// Bind gradient texture and setup sampler parameters.
	gl.bindTexture(GL_TEXTURE_2D, m_textures[curTexNdx]->getGLTexture());
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		m_wrapT);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	m_magFilter);

	// Setup params for reference.
	refParams.sampler		= mapGLSampler(m_wrapS, m_wrapT, m_minFilter, m_magFilter);
	refParams.samplerType	= getSamplerType(texFmt);
	refParams.lodMode		= LODMODE_EXACT;
	refParams.colorBias		= fmtInfo.lookupBias;
	refParams.colorScale	= fmtInfo.lookupScale;

	// Bottom left: Minification
	{
		gl.viewport(viewport.x, viewport.y, leftWidth, bottomHeight);

		computeQuadTexCoord2D(texCoord, tcu::Vec2(-4.0f, -4.5f), tcu::Vec2(4.0f, 2.5f));

		m_renderer.renderQuad(0, &texCoord[0], refParams);
		sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat(), 0, 0, leftWidth, bottomHeight),
					  m_textures[curTexNdx]->getRefTexture(), &texCoord[0], refParams);
	}

	// Bottom right: Magnification
	{
		gl.viewport(viewport.x+leftWidth, viewport.y, rightWidth, bottomHeight);

		computeQuadTexCoord2D(texCoord, tcu::Vec2(-0.5f, 0.75f), tcu::Vec2(0.25f, 1.25f));

		m_renderer.renderQuad(0, &texCoord[0], refParams);
		sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat(), leftWidth, 0, rightWidth, bottomHeight),
					  m_textures[curTexNdx]->getRefTexture(), &texCoord[0], refParams);
	}

	if (m_textures.size() >= 2)
	{
		curTexNdx += 1;

		// Setup second texture.
		gl.bindTexture(GL_TEXTURE_2D, m_textures[curTexNdx]->getGLTexture());
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		m_wrapS);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		m_wrapT);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	m_magFilter);
	}

	// Top left: Minification
	// \note Minification is chosen so that 0.0 < lod <= 0.5. This way special minification threshold rule will be triggered.
	{
		gl.viewport(viewport.x, viewport.y+bottomHeight, leftWidth, topHeight);

		float	sMin		= -0.5f;
		float	tMin		= -0.2f;
		float	sRange		= ((float)leftWidth * 1.2f) / (float)m_textures[curTexNdx]->getRefTexture().getWidth();
		float	tRange		= ((float)topHeight * 1.1f) / (float)m_textures[curTexNdx]->getRefTexture().getHeight();

		computeQuadTexCoord2D(texCoord, tcu::Vec2(sMin, tMin), tcu::Vec2(sMin+sRange, tMin+tRange));

		m_renderer.renderQuad(0, &texCoord[0], refParams);
		sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat(), 0, bottomHeight, leftWidth, topHeight),
					  m_textures[curTexNdx]->getRefTexture(), &texCoord[0], refParams);
	}

	// Top right: Magnification
	{
		gl.viewport(viewport.x+leftWidth, viewport.y+bottomHeight, rightWidth, topHeight);

		computeQuadTexCoord2D(texCoord, tcu::Vec2(-0.5f, 0.75f), tcu::Vec2(0.25f, 1.25f));

		m_renderer.renderQuad(0, &texCoord[0], refParams);
		sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat(), leftWidth, bottomHeight, rightWidth, topHeight),
					  m_textures[curTexNdx]->getRefTexture(), &texCoord[0], refParams);
	}

	// Read result.
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());

	// Compare and log.
	{
		DE_ASSERT(getNodeType() == tcu::NODETYPE_ACCURACY);

		const int	bestScoreDiff	= 16;
		const int	worstScoreDiff	= 3200;

		int score = measureAccuracy(log, referenceFrame, renderedFrame, bestScoreDiff, worstScoreDiff);
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::toString(score).c_str());
	}

	return STOP;
}